

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<4,_7,_7>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  undefined8 *puVar1;
  float *pfVar2;
  long lVar3;
  undefined4 *puVar4;
  Vector<float,_4> *b;
  long lVar5;
  Vector<float,_4> *pVVar6;
  long lVar7;
  undefined4 uVar8;
  Vector<float,_3> res;
  Type in1;
  Type in0;
  float afStack_b8 [6];
  Vec4 *local_a0;
  float local_98 [5];
  float local_84 [3];
  Matrix<float,_4,_2> local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  Vec4 *local_30;
  float local_28;
  float local_1c [2];
  float local_14;
  
  puVar1 = &local_58;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar7 = 0;
      do {
        uVar8 = 0x3f800000;
        if (lVar3 != lVar7) {
          uVar8 = 0;
        }
        *(undefined4 *)((long)puVar1 + lVar7) = uVar8;
        lVar7 = lVar7 + 0x10;
      } while (lVar7 == 0x10);
      lVar5 = lVar5 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      lVar3 = lVar3 + 0x10;
    } while (lVar5 != 4);
    local_58 = *(undefined8 *)evalCtx->in[0].m_data;
    uStack_50 = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_48 = *(undefined8 *)evalCtx->in[1].m_data;
    uStack_40 = *(undefined8 *)(evalCtx->in[1].m_data + 2);
  }
  else {
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    puVar4 = &s_constInMat2x4;
    lVar3 = 0;
    do {
      lVar5 = 0;
      do {
        *(undefined4 *)((long)puVar1 + lVar5 * 4) = *(undefined4 *)((long)puVar4 + lVar5);
        lVar5 = lVar5 + 4;
      } while (lVar5 == 4);
      lVar3 = lVar3 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      puVar4 = puVar4 + 2;
    } while (lVar3 != 4);
  }
  pfVar2 = (float *)&local_78;
  if (in1Type == INPUTTYPE_DYNAMIC) {
    b = (Vector<float,_4> *)0x0;
    lVar3 = 0;
    do {
      pVVar6 = (Vector<float,_4> *)0x0;
      do {
        uVar8 = 0x3f800000;
        if (b != pVVar6) {
          uVar8 = 0;
        }
        *(undefined4 *)((long)pfVar2 + (long)pVVar6) = uVar8;
        pVVar6 = pVVar6 + 1;
      } while (pVVar6 == (Vector<float,_4> *)0x10);
      lVar3 = lVar3 + 1;
      pfVar2 = pfVar2 + 1;
      b = (((Matrix<float,_4,_2> *)b)->m_data).m_data + 1;
    } while (lVar3 != 4);
    local_78.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_78.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_78.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    local_78.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
  }
  else {
    local_78.m_data.m_data[1].m_data[0] = 0.0;
    local_78.m_data.m_data[1].m_data[1] = 0.0;
    local_78.m_data.m_data[1].m_data[2] = 0.0;
    local_78.m_data.m_data[1].m_data[3] = 0.0;
    local_78.m_data.m_data[0].m_data[0] = 0.0;
    local_78.m_data.m_data[0].m_data[1] = 0.0;
    local_78.m_data.m_data[0].m_data[2] = 0.0;
    local_78.m_data.m_data[0].m_data[3] = 0.0;
    b = (Vector<float,_4> *)&DAT_00b0b9d0;
    lVar3 = 0;
    do {
      lVar5 = 0;
      do {
        pfVar2[lVar5] = *(float *)((long)b->m_data + lVar5);
        lVar5 = lVar5 + 4;
      } while (lVar5 == 4);
      lVar3 = lVar3 + 1;
      pfVar2 = pfVar2 + 1;
      b = (Vector<float,_4> *)(b->m_data + 2);
    } while (lVar3 != 4);
  }
  matrixCompMult<float,4,2>
            ((Matrix<float,_4,_2> *)&local_30,(MatrixCaseUtils *)&local_58,&local_78,
             (Matrix<float,_4,_2> *)b);
  local_a0 = local_30;
  local_98[0] = local_28;
  local_84[0] = local_1c[0];
  local_84[1] = local_1c[1];
  local_84[2] = local_14;
  afStack_b8[2] = 0.0;
  afStack_b8[3] = 0.0;
  afStack_b8[4] = 0.0;
  lVar3 = 0;
  do {
    afStack_b8[lVar3 + 2] = *(float *)((long)&local_a0 + lVar3 * 4) + local_84[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_a0 = &evalCtx->color;
  local_98[0] = 0.0;
  local_98[1] = 1.4013e-45;
  local_98[2] = 2.8026e-45;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_a0 + lVar3 * 4)] = afStack_b8[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(matrixCompMult(in0, in1));
	}